

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase982::run(TestCase982 *this)

{
  pointer_____offset_0x10___ puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  Server *pSVar4;
  WirePointer *pWVar5;
  long lVar6;
  ClientHook *pCVar7;
  RequestHook *pRVar8;
  long *plVar9;
  long *plVar10;
  char *__n;
  Disposer *pDVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  Disposer *pDVar12;
  Own<capnp::ClientHook> OVar13;
  int callCount;
  Client client;
  WaitScope waitScope;
  EventLoop loop;
  int local_22c;
  undefined1 local_228 [12];
  undefined4 uStack_21c;
  undefined8 local_218;
  WirePointer *local_210;
  long local_208;
  Disposer *pDStack_200;
  RequestHook *local_1f8;
  undefined1 local_1e8 [16];
  Server *pSStack_1d8;
  undefined1 local_1d0 [8];
  Client local_1c8;
  EventLoop *local_1b8;
  undefined4 local_1b0;
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  local_1a8;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_> local_170 [3];
  undefined8 *local_140;
  long *local_138;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_> local_130 [3];
  undefined8 *local_100;
  long *local_f8;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_> local_f0 [3];
  undefined8 *local_c0;
  long *local_b8;
  EventLoop local_b0;
  Maybe<capnp::MessageSize> local_78;
  Maybe<capnp::MessageSize> local_60;
  Maybe<capnp::MessageSize> local_48;
  
  local_22c = 0;
  kj::EventLoop::EventLoop(&local_b0);
  local_1b0 = 0xffffffff;
  local_1b8 = &local_b0;
  kj::EventLoop::enterScope(&local_b0);
  plVar10 = (long *)operator_new(0x20);
  register0x00000000 = (Server *)(plVar10 + 2);
  plVar10[3] = 0;
  *plVar10 = (long)&PTR_dispatchCall_00609160;
  plVar10[2] = (long)&PTR_dispatchCall_00609198;
  plVar10[1] = (long)&local_22c;
  __n = (char *)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestThisCap>::instance;
  local_228._0_8_ = &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestThisCap>::instance;
  OVar13 = Capability::Client::makeLocalClient
                     (&local_1c8,(Own<capnp::Capability::Server> *)local_228);
  pSVar4 = stack0xfffffffffffffde0;
  if (stack0xfffffffffffffde0 != (Server *)0x0) {
    stack0xfffffffffffffde0 = (Server *)0x0;
    (*(code *)((SegmentReader *)local_228._0_8_)->arena->_vptr_Arena)
              (local_228._0_8_,
               (_func_int *)((long)&pSVar4->_vptr_Server + (long)pSVar4->_vptr_Server[-2]),
               OVar13.ptr);
  }
  local_1d0 = (undefined1  [8])&Capability::Client::typeinfo;
  local_48.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::barRequest
            (&local_1a8,(Client *)local_1d0,&local_48);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
          *)local_228,(int)&local_1a8,__buf,(size_t)__n,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>::wait
            (local_f0,local_228);
  plVar9 = local_b8;
  if (local_b8 != (long *)0x0) {
    local_b8 = (long *)0x0;
    (**(code **)*local_c0)(local_c0,(long)plVar9 + *(long *)(*plVar9 + -0x10));
  }
  pDVar11 = pDStack_200;
  lVar6 = local_208;
  if (local_208 != 0) {
    local_208 = 0;
    pDStack_200 = (Disposer *)0x0;
    pDVar12 = pDVar11;
    (**local_1f8->_vptr_RequestHook)(local_1f8,lVar6,8,pDVar11,pDVar11,0);
    in_R8D = (int)pDVar12;
    __n = (char *)pDVar11;
  }
  pWVar5 = local_210;
  if (local_210 != (WirePointer *)0x0) {
    local_210 = (WirePointer *)0x0;
    (**(code **)*local_218)
              (local_218,(long)&(pWVar5->offsetAndKind).value + *(long *)((long)*pWVar5 + -0x10));
  }
  pSVar4 = stack0xfffffffffffffde0;
  if (stack0xfffffffffffffde0 != (Server *)0x0) {
    stack0xfffffffffffffde0 = (Server *)0x0;
    (*(code *)((SegmentReader *)local_228._0_8_)->arena->_vptr_Arena)
              (local_228._0_8_,
               (_func_int *)((long)&pSVar4->_vptr_Server + (long)pSVar4->_vptr_Server[-2]));
  }
  pRVar8 = local_1a8.hook.ptr;
  if (local_1a8.hook.ptr != (RequestHook *)0x0) {
    local_1a8.hook.ptr = (RequestHook *)0x0;
    (**(local_1a8.hook.disposer)->_vptr_Disposer)
              (local_1a8.hook.disposer,
               pRVar8->_vptr_RequestHook[-2] + (long)&pRVar8->_vptr_RequestHook);
  }
  if ((local_22c != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_228._0_4_ = 1;
    __n = "\"failed: expected \" \"(1) == (callCount)\", 1, callCount";
    in_R8D = 0x4ac0bd;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3e0,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
               (char (*) [36])"failed: expected (1) == (callCount)",(int *)local_228,&local_22c);
  }
  (**(code **)(**(long **)((long)plVar10 + *(long *)(*plVar10 + -0x18) + 8) + 0x20))(local_228);
  pSVar4 = stack0xfffffffffffffde0;
  uVar3 = local_228._0_8_;
  (*stack0xfffffffffffffde0->_vptr_Server[4])(local_228,stack0xfffffffffffffde0);
  local_1e8._8_4_ = local_228._0_4_;
  local_1e8._12_4_ = local_228._4_4_;
  pSStack_1d8 = stack0xfffffffffffffde0;
  local_1e8._0_8_ = &Capability::Client::typeinfo;
  (*(code *)((SegmentReader *)uVar3)->arena->_vptr_Arena)
            (uVar3,(_func_int *)((long)&pSVar4->_vptr_Server + (long)pSVar4->_vptr_Server[-2]));
  if ((local_22c != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_228._0_4_ = 1;
    __n = "\"failed: expected \" \"(1) == (callCount)\", 1, callCount";
    in_R8D = 0x4ac0bd;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3e3,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
               (char (*) [36])"failed: expected (1) == (callCount)",(int *)local_228,&local_22c);
  }
  local_60.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::barRequest
            (&local_1a8,(Client *)local_1e8,&local_60);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
          *)local_228,(int)&local_1a8,__buf_00,(size_t)__n,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>::wait
            (local_130,local_228);
  plVar10 = local_f8;
  if (local_f8 != (long *)0x0) {
    local_f8 = (long *)0x0;
    (**(code **)*local_100)(local_100,(long)plVar10 + *(long *)(*plVar10 + -0x10));
  }
  pDVar11 = pDStack_200;
  lVar6 = local_208;
  if (local_208 != 0) {
    local_208 = 0;
    pDStack_200 = (Disposer *)0x0;
    pDVar12 = pDVar11;
    (**local_1f8->_vptr_RequestHook)(local_1f8,lVar6,8,pDVar11,pDVar11,0);
    in_R8D = (int)pDVar12;
    __n = (char *)pDVar11;
  }
  pWVar5 = local_210;
  if (local_210 != (WirePointer *)0x0) {
    local_210 = (WirePointer *)0x0;
    (**(code **)*local_218)
              (local_218,(long)&(pWVar5->offsetAndKind).value + *(long *)((long)*pWVar5 + -0x10));
  }
  pSVar4 = stack0xfffffffffffffde0;
  if (stack0xfffffffffffffde0 != (Server *)0x0) {
    stack0xfffffffffffffde0 = (Server *)0x0;
    (*(code *)((SegmentReader *)local_228._0_8_)->arena->_vptr_Arena)
              (local_228._0_8_,
               (_func_int *)((long)&pSVar4->_vptr_Server + (long)pSVar4->_vptr_Server[-2]));
  }
  if (local_1a8.hook.ptr != (RequestHook *)0x0) {
    local_1a8.hook.ptr = (RequestHook *)0x0;
    (**(local_1a8.hook.disposer)->_vptr_Disposer)();
  }
  if ((local_22c != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_228._0_4_ = 2;
    __n = "\"failed: expected \" \"(2) == (callCount)\", 2, callCount";
    in_R8D = 0x4a935f;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3e5,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
               (char (*) [36])"failed: expected (2) == (callCount)",(int *)local_228,&local_22c);
  }
  Capability::Client::Client((Client *)(local_228 + 8),(void *)0x0);
  local_228._0_8_ = &Capability::Client::typeinfo;
  puVar1 = *(pointer_____offset_0x10___ *)((long)local_1d0 + -0x18);
  puVar2 = *(undefined8 **)(local_1d0 + (long)puVar1);
  plVar10 = *(long **)(puVar1 + (long)&local_1c8.hook);
  *(undefined4 *)(local_1d0 + (long)puVar1) = local_228._8_4_;
  *(undefined4 *)(puVar1 + (long)(local_1d0 + 4)) = uStack_21c;
  *(undefined4 *)(puVar1 + (long)&local_1c8.hook) = (undefined4)local_218;
  *(undefined4 *)(puVar1 + (long)((long)&local_1c8.hook.disposer + 4)) = local_218._4_4_;
  local_218 = (long *)0x0;
  if (plVar10 != (long *)0x0) {
    (**(code **)*puVar2)(puVar2,(long)plVar10 + *(long *)(*plVar10 + -0x10));
    plVar10 = local_218;
    if (local_218 != (long *)0x0) {
      local_218 = (long *)0x0;
      (**stack0xfffffffffffffde0->_vptr_Server)
                (stack0xfffffffffffffde0,*(long *)(*plVar10 + -0x10) + (long)plVar10);
    }
  }
  if ((local_22c != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_228._0_4_ = 2;
    __n = "\"failed: expected \" \"(2) == (callCount)\", 2, callCount";
    in_R8D = 0x4a935f;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3e9,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
               (char (*) [36])"failed: expected (2) == (callCount)",(int *)local_228,&local_22c);
  }
  local_78.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::barRequest
            (&local_1a8,(Client *)local_1e8,&local_78);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
          *)local_228,(int)&local_1a8,__buf_01,(size_t)__n,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>::wait
            (local_170,local_228);
  plVar10 = local_138;
  if (local_138 != (long *)0x0) {
    local_138 = (long *)0x0;
    (**(code **)*local_140)(local_140,(long)plVar10 + *(long *)(*plVar10 + -0x10));
  }
  pDVar11 = pDStack_200;
  lVar6 = local_208;
  if (local_208 != 0) {
    local_208 = 0;
    pDStack_200 = (Disposer *)0x0;
    (**local_1f8->_vptr_RequestHook)(local_1f8,lVar6,8,pDVar11,pDVar11,0);
  }
  pWVar5 = local_210;
  if (local_210 != (WirePointer *)0x0) {
    local_210 = (WirePointer *)0x0;
    (**(code **)*local_218)
              (local_218,(long)&(pWVar5->offsetAndKind).value + *(long *)((long)*pWVar5 + -0x10));
  }
  pSVar4 = stack0xfffffffffffffde0;
  if (stack0xfffffffffffffde0 != (Server *)0x0) {
    stack0xfffffffffffffde0 = (Server *)0x0;
    (**(code **)((SegmentReader *)local_228._0_8_)->arena)
              (local_228._0_8_,
               (_func_int *)((long)&pSVar4->_vptr_Server + (long)pSVar4->_vptr_Server[-2]));
  }
  if (local_1a8.hook.ptr != (RequestHook *)0x0) {
    local_1a8.hook.ptr = (RequestHook *)0x0;
    (**(local_1a8.hook.disposer)->_vptr_Disposer)();
  }
  if ((local_22c != 3) && (kj::_::Debug::minSeverity < 3)) {
    local_228._0_4_ = 3;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3eb,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
               (char (*) [36])"failed: expected (3) == (callCount)",(int *)local_228,&local_22c);
  }
  Capability::Client::Client((Client *)(local_228 + 8),(void *)0x0);
  local_228._0_8_ = &Capability::Client::typeinfo;
  puVar1 = *(pointer_____offset_0x10___ *)(local_1e8._0_8_ + -0x18);
  puVar2 = *(undefined8 **)(local_1e8 + (long)puVar1);
  plVar10 = *(long **)(puVar1 + (long)(local_1e8 + 8));
  *(undefined4 *)(local_1e8 + (long)puVar1) = local_228._8_4_;
  *(undefined4 *)(puVar1 + (long)(local_1e8 + 4)) = uStack_21c;
  *(undefined4 *)(puVar1 + (long)(local_1e8 + 8)) = (undefined4)local_218;
  *(undefined4 *)(puVar1 + (long)(local_1e8 + 0xc)) = local_218._4_4_;
  local_218 = (long *)0x0;
  if (plVar10 != (long *)0x0) {
    (**(code **)*puVar2)(puVar2,(long)plVar10 + *(long *)(*plVar10 + -0x10));
    plVar10 = local_218;
    if (local_218 != (long *)0x0) {
      local_218 = (long *)0x0;
      (**stack0xfffffffffffffde0->_vptr_Server)
                (stack0xfffffffffffffde0,*(long *)(*plVar10 + -0x10) + (long)plVar10);
    }
  }
  if ((local_22c != -1) && (kj::_::Debug::minSeverity < 3)) {
    local_228._0_4_ = 0xffffffff;
    kj::_::Debug::log<char_const(&)[37],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3ef,ERROR,"\"failed: expected \" \"(-1) == (callCount)\", -1, callCount",
               (char (*) [37])"failed: expected (-1) == (callCount)",(int *)local_228,&local_22c);
  }
  pSVar4 = pSStack_1d8;
  if (pSStack_1d8 != (Server *)0x0) {
    pSStack_1d8 = (Server *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_1e8._12_4_,local_1e8._8_4_))
              ((undefined8 *)CONCAT44(local_1e8._12_4_,local_1e8._8_4_),
               (_func_int *)((long)&pSVar4->_vptr_Server + (long)pSVar4->_vptr_Server[-2]));
  }
  pCVar7 = local_1c8.hook.ptr;
  if (local_1c8.hook.ptr != (ClientHook *)0x0) {
    local_1c8.hook.ptr = (ClientHook *)0x0;
    (**(local_1c8.hook.disposer)->_vptr_Disposer)
              (local_1c8.hook.disposer,
               pCVar7->_vptr_ClientHook[-2] + (long)&pCVar7->_vptr_ClientHook);
  }
  kj::EventLoop::leaveScope(local_1b8);
  kj::EventLoop::~EventLoop(&local_b0);
  return;
}

Assistant:

TEST(Capability, ThisCap) {
  int callCount = 0;
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  auto server = kj::heap<TestThisCap>(callCount);
  TestThisCap* serverPtr = server;

  test::TestInterface::Client client = kj::mv(server);
  client.barRequest().send().wait(waitScope);
  EXPECT_EQ(1, callCount);

  test::TestInterface::Client client2 = serverPtr->getSelf();
  EXPECT_EQ(1, callCount);
  client2.barRequest().send().wait(waitScope);
  EXPECT_EQ(2, callCount);

  client = nullptr;

  EXPECT_EQ(2, callCount);
  client2.barRequest().send().wait(waitScope);
  EXPECT_EQ(3, callCount);

  client2 = nullptr;

  EXPECT_EQ(-1, callCount);
}